

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult vmaFindMemoryTypeIndexForBufferInfo
                   (VmaAllocator allocator,VkBufferCreateInfo *pBufferCreateInfo,
                   VmaAllocationCreateInfo *pAllocationCreateInfo,uint32_t *pMemoryTypeIndex)

{
  VkDevice pVVar1;
  PFN_vkGetDeviceBufferMemoryRequirements p_Var2;
  VkResult VVar3;
  VkAllocationCallbacks *pVVar4;
  VkAllocationCallbacks *pVVar5;
  VkDeviceBufferMemoryRequirements devBufMemReq;
  VkMemoryRequirements2 memReq;
  VkDeviceBufferMemoryRequirements local_78;
  VkMemoryRequirements2 local_58;
  
  pVVar1 = allocator->m_hDevice;
  p_Var2 = (allocator->m_VulkanFunctions).vkGetDeviceBufferMemoryRequirements;
  if (p_Var2 == (PFN_vkGetDeviceBufferMemoryRequirements)0x0) {
    local_78._0_8_ = (VkBuffer)0x0;
    pVVar5 = &allocator->m_AllocationCallbacks;
    pVVar4 = (VkAllocationCallbacks *)0x0;
    if (allocator->m_AllocationCallbacksSpecified != false) {
      pVVar4 = pVVar5;
    }
    VVar3 = (*(allocator->m_VulkanFunctions).vkCreateBuffer)
                      (pVVar1,pBufferCreateInfo,pVVar4,(VkBuffer *)&local_78);
    if (VVar3 == VK_SUCCESS) {
      local_58.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      local_58._4_4_ = 0;
      local_58.pNext = (void *)0x0;
      local_58.memoryRequirements.size = 0;
      (*(allocator->m_VulkanFunctions).vkGetBufferMemoryRequirements)
                (pVVar1,(VkBuffer)local_78._0_8_,(VkMemoryRequirements *)&local_58);
      VVar3 = VmaAllocator_T::FindMemoryTypeIndex
                        (allocator,(uint32_t)local_58.memoryRequirements.size,pAllocationCreateInfo,
                         pBufferCreateInfo->usage,pMemoryTypeIndex);
      if (allocator->m_AllocationCallbacksSpecified == false) {
        pVVar5 = (VkAllocationCallbacks *)0x0;
      }
      (*(allocator->m_VulkanFunctions).vkDestroyBuffer)(pVVar1,(VkBuffer)local_78._0_8_,pVVar5);
    }
  }
  else {
    local_78.sType = VK_STRUCTURE_TYPE_DEVICE_BUFFER_MEMORY_REQUIREMENTS;
    local_78._4_4_ = 0;
    local_78.pNext = (void *)0x0;
    local_58.pNext = (void *)0x0;
    local_58.memoryRequirements.size = 0;
    local_58.memoryRequirements.alignment = 0;
    local_58.memoryRequirements.memoryTypeBits = 0;
    local_58.memoryRequirements._20_4_ = 0;
    local_58.sType = VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2;
    local_58._4_4_ = 0;
    local_78.pCreateInfo = pBufferCreateInfo;
    (*p_Var2)(pVVar1,&local_78,&local_58);
    VVar3 = VmaAllocator_T::FindMemoryTypeIndex
                      (allocator,local_58.memoryRequirements.memoryTypeBits,pAllocationCreateInfo,
                       pBufferCreateInfo->usage,pMemoryTypeIndex);
  }
  return VVar3;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaFindMemoryTypeIndexForBufferInfo(
    VmaAllocator allocator,
    const VkBufferCreateInfo* pBufferCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    uint32_t* pMemoryTypeIndex)
{
    VMA_ASSERT(allocator != VK_NULL_HANDLE);
    VMA_ASSERT(pBufferCreateInfo != VMA_NULL);
    VMA_ASSERT(pAllocationCreateInfo != VMA_NULL);
    VMA_ASSERT(pMemoryTypeIndex != VMA_NULL);

    const VkDevice hDev = allocator->m_hDevice;
    const VmaVulkanFunctions* funcs = &allocator->GetVulkanFunctions();
    VkResult res;

#if VMA_VULKAN_VERSION >= 1003000
    if(funcs->vkGetDeviceBufferMemoryRequirements)
    {
        // Can query straight from VkBufferCreateInfo :)
        VkDeviceBufferMemoryRequirements devBufMemReq = {VK_STRUCTURE_TYPE_DEVICE_BUFFER_MEMORY_REQUIREMENTS};
        devBufMemReq.pCreateInfo = pBufferCreateInfo;

        VkMemoryRequirements2 memReq = {VK_STRUCTURE_TYPE_MEMORY_REQUIREMENTS_2};
        (*funcs->vkGetDeviceBufferMemoryRequirements)(hDev, &devBufMemReq, &memReq);

        res = allocator->FindMemoryTypeIndex(
            memReq.memoryRequirements.memoryTypeBits, pAllocationCreateInfo, pBufferCreateInfo->usage, pMemoryTypeIndex);
    }
    else
#endif // #if VMA_VULKAN_VERSION >= 1003000
    {
        // Must create a dummy buffer to query :(
        VkBuffer hBuffer = VK_NULL_HANDLE;
        res = funcs->vkCreateBuffer(
            hDev, pBufferCreateInfo, allocator->GetAllocationCallbacks(), &hBuffer);
        if(res == VK_SUCCESS)
        {
            VkMemoryRequirements memReq = {};
            funcs->vkGetBufferMemoryRequirements(hDev, hBuffer, &memReq);

            res = allocator->FindMemoryTypeIndex(
                memReq.memoryTypeBits, pAllocationCreateInfo, pBufferCreateInfo->usage, pMemoryTypeIndex);

            funcs->vkDestroyBuffer(
                hDev, hBuffer, allocator->GetAllocationCallbacks());
        }
    }
    return res;
}